

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O2

void Eigen::internal::
     triangular_assignment_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U,_-1,_true>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,__1,_0,__1,__1> *src)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  lVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (lVar5 < 1) {
    lVar5 = 0;
  }
  lVar1 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar9 = 0;
  lVar10 = 0;
  lVar6 = 0;
  lVar12 = 0;
  lVar13 = 0;
  while( true ) {
    lVar11 = lVar13;
    if (lVar1 < lVar13) {
      lVar11 = lVar1;
    }
    lVar8 = lVar13;
    if (lVar13 < lVar1) {
      lVar8 = lVar1;
    }
    if (lVar11 < 1) {
      lVar11 = 0;
    }
    if (lVar13 == lVar5) break;
    lVar2 = (src->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
    ;
    pdVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    pdVar4 = (src->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    for (lVar7 = 0; lVar8 + lVar12 != lVar7; lVar7 = lVar7 + 1) {
      *(undefined8 *)((long)pdVar3 + lVar7 * 8 + lVar6) =
           *(undefined8 *)((long)pdVar4 + lVar7 * 8 + (lVar2 + 1) * lVar10);
    }
    pdVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    for (lVar8 = 0; lVar11 != lVar8; lVar8 = lVar8 + 1) {
      *(undefined8 *)((long)pdVar3 + lVar8 * 8 + lVar9) = 0;
    }
    lVar13 = lVar13 + 1;
    lVar12 = lVar12 + -1;
    lVar6 = lVar6 + lVar1 * 8 + 8;
    lVar10 = lVar10 + 8;
    lVar9 = lVar9 + lVar1 * 8;
  }
  return;
}

Assistant:

static inline void run(Derived1 &dst, const Derived2 &src)
  {
    for(Index j = 0; j < dst.cols(); ++j)
    {
      for(Index i = j; i < dst.rows(); ++i)
        dst.copyCoeff(i, j, src);
      Index maxi = (std::min)(j, dst.rows());
      if (ClearOpposite)
        for(Index i = 0; i < maxi; ++i)
          dst.coeffRef(i, j) = static_cast<typename Derived1::Scalar>(0);
    }
  }